

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  greatest_test_res gVar2;
  greatest_test_res res_10;
  greatest_test_res res_9;
  greatest_test_res res_8;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  char **argv_local;
  int argc_local;
  
  GREATEST_INIT();
  greatest_parse_options(argc,argv);
  iVar1 = greatest_test_pre("weird_network");
  if (iVar1 == 1) {
    gVar2 = weird_network();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("weird_network2");
  if (iVar1 == 1) {
    gVar2 = weird_network2();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("weird_network3");
  if (iVar1 == 1) {
    gVar2 = weird_network3();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("CLRS_network");
  if (iVar1 == 1) {
    gVar2 = CLRS_network();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("non_trivial_network1");
  if (iVar1 == 1) {
    gVar2 = non_trivial_network1();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("non_trivial_network2");
  if (iVar1 == 1) {
    gVar2 = non_trivial_network2();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("non_trivial_network3");
  if (iVar1 == 1) {
    gVar2 = non_trivial_network3();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("no_path_flow");
  if (iVar1 == 1) {
    gVar2 = no_path_flow();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("single_path_flow");
  if (iVar1 == 1) {
    gVar2 = single_path_flow();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("two_path_flow");
  if (iVar1 == 1) {
    gVar2 = two_path_flow();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("random_networks");
  if (iVar1 == 1) {
    gVar2 = random_networks();
    greatest_test_post(gVar2);
  }
  GREATEST_PRINT_REPORT();
  iVar1 = greatest_all_passed();
  return (uint)(iVar1 == 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}